

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

Vec_Bit_t * Gia_ManGenUsed(Gia_Man_t *p,int fBuf)

{
  int iVar1;
  Vec_Bit_t *p_00;
  bool bVar2;
  Vec_Bit_t *vUsed;
  Gia_Obj_t *pGStack_20;
  int i;
  Gia_Obj_t *pObj;
  int fBuf_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar1);
  vUsed._4_4_ = 0;
  while( true ) {
    bVar2 = false;
    if (vUsed._4_4_ < p->nObjs) {
      pGStack_20 = Gia_ManObj(p,vUsed._4_4_);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsAnd(pGStack_20);
    if (iVar1 != 0) {
      if (fBuf != 0) {
        Vec_BitWriteEntry(p_00,vUsed._4_4_,1);
      }
      iVar1 = Gia_ObjFaninC0(pGStack_20);
      if (iVar1 != fBuf) {
        iVar1 = Gia_ObjFaninId0(pGStack_20,vUsed._4_4_);
        Vec_BitWriteEntry(p_00,iVar1,1);
      }
      iVar1 = Gia_ObjFaninC1(pGStack_20);
      if (iVar1 != fBuf) {
        iVar1 = Gia_ObjFaninId1(pGStack_20,vUsed._4_4_);
        Vec_BitWriteEntry(p_00,iVar1,1);
      }
    }
    vUsed._4_4_ = vUsed._4_4_ + 1;
  }
  vUsed._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar2 = false;
    if (vUsed._4_4_ < iVar1) {
      pGStack_20 = Gia_ManCo(p,vUsed._4_4_);
      bVar2 = pGStack_20 != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjFaninC0(pGStack_20);
    if (iVar1 != fBuf) {
      iVar1 = Gia_ObjFaninId0p(p,pGStack_20);
      Vec_BitWriteEntry(p_00,iVar1,1);
    }
    vUsed._4_4_ = vUsed._4_4_ + 1;
  }
  Vec_BitWriteEntry(p_00,0,0);
  return p_00;
}

Assistant:

Vec_Bit_t * Gia_ManGenUsed( Gia_Man_t * p, int fBuf )
{
    Gia_Obj_t * pObj; int i;
    Vec_Bit_t * vUsed = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( fBuf )
            Vec_BitWriteEntry( vUsed, i, 1 );
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0(pObj, i), 1 );
        if ( Gia_ObjFaninC1(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId1(pObj, i), 1 );
    }
    Gia_ManForEachCo( p, pObj, i )
        if ( Gia_ObjFaninC0(pObj) ^ fBuf )
            Vec_BitWriteEntry( vUsed, Gia_ObjFaninId0p(p, pObj), 1 );
    Vec_BitWriteEntry( vUsed, 0, 0 ); // clean zero
    return vUsed;
}